

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O0

void helics::fileops::replaceIfMember(value *element,string *key,string *loc)

{
  bool bVar1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  basic_value<toml::type_config> *this;
  basic_value<toml::type_config> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_value<toml::type_config> *in_stack_fffffffffffffe48;
  basic_value<toml::type_config> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  value *in_stack_ffffffffffffffb8;
  
  this = (basic_value<toml::type_config> *)&stack0xffffffffffffff20;
  toml::basic_value<toml::type_config>::basic_value(this);
  toml::find_or<toml::type_config,std::__cxx11::string>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x255594)
  ;
  if (!bVar1) {
    tomlAsString_abi_cxx11_(in_stack_ffffffffffffffb8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  toml::basic_value<toml::type_config>::~basic_value(this);
  toml::basic_value<toml::type_config>::~basic_value(this);
  return;
}

Assistant:

inline void replaceIfMember(const toml::value& element, const std::string& key, std::string& loc)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        loc = tomlAsString(val);
    }
}